

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

char MeCab::getEscapedChar(char p)

{
  char cVar1;
  undefined3 in_register_00000039;
  int iVar2;
  
  iVar2 = CONCAT31(in_register_00000039,p);
  cVar1 = '\0';
  switch(iVar2) {
  case 0x6e:
    cVar1 = '\n';
    break;
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x75:
    break;
  case 0x72:
    return '\r';
  case 0x73:
    return ' ';
  case 0x74:
    return '\t';
  case 0x76:
    return '\v';
  default:
    if (iVar2 == 0x5c) {
      return '\\';
    }
    if (iVar2 == 0x66) {
      return '\f';
    }
    if (iVar2 == 0x62) {
      return '\b';
    }
    if (iVar2 == 0x61) {
      return '\a';
    }
  }
  return cVar1;
}

Assistant:

inline char getEscapedChar(const char p) {
  switch (p) {
    case '0':  return '\0';
    case 'a':  return '\a';
    case 'b':  return '\b';
    case 't':  return '\t';
    case 'n':  return '\n';
    case 'v':  return '\v';
    case 'f':  return '\f';
    case 'r':  return '\r';
    case 's':  return ' ';
    case '\\': return '\\';
    default: break;
  }

  return '\0';  // never be here
}